

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O0

bool magic_enum::detail::cmp_equal<____C_A_T_C_H____T_E_S_T____0()::__1&>
               (string_view lhs,string_view rhs,anon_class_1_0_00000001 *p)

{
  wchar_t lhs_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  wchar_t *pwVar4;
  size_type local_50;
  size_t i;
  size_type size;
  bool workaround;
  anon_class_1_0_00000001 *p_local;
  string_view rhs_local;
  string_view lhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  p_local = (anon_class_1_0_00000001 *)rhs._M_len;
  rhs_local._M_str = (wchar_t *)lhs._M_len;
  sVar2 = Catch::clara::std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&rhs_local._M_str);
  sVar3 = Catch::clara::std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&p_local);
  if (sVar2 == sVar3) {
    sVar2 = Catch::clara::std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&rhs_local._M_str);
    for (local_50 = 0; local_50 < sVar2; local_50 = local_50 + 1) {
      pwVar4 = Catch::clara::std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                          &rhs_local._M_str,local_50);
      lhs_00 = *pwVar4;
      pwVar4 = Catch::clara::std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&p_local,
                          local_50);
      bVar1 = ____C_A_T_C_H____T_E_S_T____0::anon_class_1_0_00000001::operator()(p,lhs_00,*pwVar4);
      if (!bVar1) {
        return false;
      }
    }
    lhs_local._M_str._7_1_ = true;
  }
  else {
    lhs_local._M_str._7_1_ = false;
  }
  return lhs_local._M_str._7_1_;
}

Assistant:

constexpr bool cmp_equal(string_view lhs, string_view rhs, [[maybe_unused]] BinaryPredicate&& p) noexcept(is_nothrow_invocable<BinaryPredicate>()) {
#if defined(_MSC_VER) && _MSC_VER < 1920 && !defined(__clang__)
  // https://developercommunity.visualstudio.com/content/problem/360432/vs20178-regression-c-failed-in-test.html
  // https://developercommunity.visualstudio.com/content/problem/232218/c-constexpr-string-view.html
  constexpr bool workaround = true;
#else
  constexpr bool workaround = false;
#endif

  if constexpr (!is_default_predicate<BinaryPredicate>() || workaround) {
    if (lhs.size() != rhs.size()) {
      return false;
    }

    const auto size = lhs.size();
    for (std::size_t i = 0; i < size; ++i) {
      if (!p(lhs[i], rhs[i])) {
        return false;
      }
    }

    return true;
  } else {
    return lhs == rhs;
  }
}